

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

bool __thiscall Graph::is_all_visited(Graph *this)

{
  ulong uVar1;
  ulong uVar2;
  bool *pbVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar2 = (ulong)this->num_node;
  bVar5 = (long)uVar2 < 2;
  if ((1 < (long)uVar2) && (this->nodes[1].visited == true)) {
    pbVar3 = &this->nodes[2].visited;
    uVar1 = 2;
    do {
      uVar4 = uVar1;
      if (uVar2 == uVar4) break;
      bVar5 = *pbVar3;
      pbVar3 = pbVar3 + 0x20;
      uVar1 = uVar4 + 1;
    } while (bVar5 != false);
    bVar5 = uVar2 <= uVar4;
  }
  return bVar5;
}

Assistant:

bool Graph::is_all_visited() const
{
	for(int i = 1; i < num_node; i++){
		if(!nodes[i].visited){
			return false;
		}
	}
	return true;
}